

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
          (sysbvm_context_t *context,sysbvm_tuple_t *node,sysbvm_tuple_t *macro,
          sysbvm_tuple_t *environment)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  ulong uVar4;
  anon_struct_8_1_f749f241 gcFrame;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t local_130;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  anon_struct_136_2_7a050327_for_gcRoots *local_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  sysbvm_tuple_t *local_f0;
  sysbvm_functionCallFrameStack_t local_e0;
  
  uVar3 = *(ulong *)(*node + 0x30);
  if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
    uVar3 = (ulong)(*(uint *)(uVar3 + 0xc) >> 3);
  }
  else {
    uVar3 = 0;
  }
  memset(&local_e0,0,0xb0);
  local_f0 = &local_130;
  local_130 = 0;
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 1;
  sysbvm_stackFrame_pushRecord(&local_108);
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 0x11;
  local_110 = &local_e0.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_128);
  sysbvm_functionCallFrameStack_begin(context,&local_e0,*macro,uVar3 + 1,0);
  local_130 = sysbvm_macroContext_create
                        (context,*node,*(sysbvm_tuple_t *)(*node + 0x10),*environment);
  sysbvm_functionCallFrameStack_push(&local_e0,local_130);
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      uVar1 = *(ulong *)(*node + 0x30);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar4 * 8);
      }
      else {
        sVar2 = 0;
      }
      sysbvm_functionCallFrameStack_push(&local_e0,sVar2);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  sysbvm_stackFrame_popRecord(&local_128);
  sysbvm_stackFrame_popRecord(&local_108);
  sVar2 = sysbvm_functionCallFrameStack_finish(context,&local_e0);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(sysbvm_context_t *context, sysbvm_tuple_t *node, sysbvm_tuple_t *macro, sysbvm_tuple_t *environment)
{
    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    struct {
        sysbvm_tuple_t macroContext;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *macro, 1 + applicationArgumentCount, 0);
    gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*unexpandedNode)->super.sourcePosition, *environment);
    sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.macroContext);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at((*unexpandedNode)->arguments, i));

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}